

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

bool __thiscall libcellml::Component::isDefined(Component *this)

{
  ComponentImpl *this_00;
  bool bVar1;
  ComponentConstPtr CStack_38;
  History history;
  
  history.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  history.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  history.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (ComponentImpl *)
            (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
  ;
  std::__shared_ptr<libcellml::Component_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component,void>
            ((__shared_ptr<libcellml::Component_const,(__gnu_cxx::_Lock_policy)2> *)&CStack_38,
             (__weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Component>);
  bVar1 = ComponentImpl::performTestWithHistory(this_00,&history,&CStack_38,DEFINED);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&CStack_38.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::~vector(&history);
  return bVar1;
}

Assistant:

ComponentPtr Component::create() noexcept
{
    return std::shared_ptr<Component> {new Component {}};
}